

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O3

void If_CluDeriveDisjoint4
               (word *pF,int nVars,int *V2P,int *P2V,If_Grp_t *g,If_Grp_t *r,word *pTruth0,
               word *pTruth1)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong local_3038 [256];
  long local_2838;
  ulong local_2038;
  long local_1838;
  ulong local_1038;
  ulong local_838;
  
  iVar5 = (int)g->nVars;
  if (6 < iVar5) {
LAB_00384405:
    __assert_fail("g->nVars <= 6 && nFSset <= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec16.c"
                  ,0x4be,
                  "void If_CluDeriveDisjoint4(word *, int, int *, int *, If_Grp_t *, If_Grp_t *, word *, word *)"
                 );
  }
  uVar12 = nVars - iVar5;
  if (4 < (int)uVar12) goto LAB_00384405;
  iVar5 = If_CluCountCofs4(pF,nVars,iVar5,(word (*) [256])local_3038);
  if (iVar5 - 5U < 0xfffffffe) {
    puts("If_CluDeriveDisjoint4(): Error!!!");
  }
  bVar2 = (byte)(1 << ((byte)uVar12 & 0x1f));
  uVar7 = (local_1838 << (bVar2 & 0x3f) | local_2038) <<
          ((byte)(1 << ((byte)uVar12 + 1 & 0x1f)) & 0x3f) |
          local_2838 << (bVar2 & 0x3f) | local_3038[0];
  *pF = uVar7;
  uVar8 = uVar12 + 2;
  if (6 < uVar8) goto LAB_003843e6;
  if (uVar8 == 6) {
    r->nVars = '\x06';
    r->nMyu = '\0';
LAB_0038428c:
    uVar7 = 0;
    do {
      r->pVars[uVar7] = (char)P2V[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar12 != uVar7);
  }
  else {
    bVar2 = (byte)(1 << ((byte)uVar8 & 0x1f));
    uVar7 = uVar7 & ~(-1L << (bVar2 & 0x3f));
    uVar4 = 0;
    uVar11 = uVar7 << (bVar2 & 0x3f);
    if (uVar8 != 0) {
      uVar11 = uVar4;
    }
    uVar11 = uVar11 | uVar7;
    uVar7 = uVar11 * 4;
    if (uVar12 < 0xfffffffe) {
      uVar7 = uVar4;
    }
    uVar7 = uVar7 | uVar11;
    uVar11 = uVar7 << 4;
    uVar1 = 2;
    if (2 < uVar8) {
      uVar11 = uVar4;
      uVar1 = uVar8;
    }
    uVar10 = 3;
    if (2 < uVar8) {
      uVar10 = uVar1;
    }
    uVar11 = uVar11 | uVar7;
    uVar7 = uVar11 << 8;
    if (uVar10 != 3) {
      uVar7 = uVar4;
    }
    uVar7 = uVar7 | uVar11;
    uVar11 = uVar7 << 0x10;
    if (1 < uVar10 - 3) {
      uVar11 = uVar4;
    }
    uVar11 = uVar11 | uVar7;
    *pF = uVar11 << 0x20 | uVar11;
    r->nVars = (byte)uVar8;
    r->nMyu = '\0';
    if (0 < (int)uVar12) goto LAB_0038428c;
  }
  r->pVars[(int)uVar12] = (char)nVars;
  r->pVars[(long)(int)uVar12 + 1] = (char)nVars + '\x01';
  bVar2 = g->nVars;
  uVar12 = (uint)(char)bVar2;
  if (uVar12 < 7) {
    if (bVar2 != 6) {
      bVar3 = (byte)(1 << (bVar2 & 0x1f));
      uVar9 = ~(-1L << (bVar3 & 0x3f));
      local_1038 = local_1038 & uVar9;
      uVar9 = uVar9 & local_838;
      uVar4 = 0;
      uVar11 = uVar9 << (bVar3 & 0x3f);
      uVar7 = local_1038 << (bVar3 & 0x3f);
      if (bVar2 != 0) {
        uVar11 = uVar4;
        uVar7 = uVar4;
      }
      uVar7 = uVar7 | local_1038;
      uVar11 = uVar11 | uVar9;
      uVar6 = uVar11 * 4;
      uVar9 = uVar7 * 4;
      if (1 < bVar2) {
        uVar6 = uVar4;
        uVar9 = uVar4;
      }
      uVar9 = uVar9 | uVar7;
      uVar8 = 2;
      if (2 < uVar12) {
        uVar8 = uVar12;
      }
      uVar6 = uVar6 | uVar11;
      uVar7 = uVar9 << 4;
      if (2 < bVar2) {
        uVar7 = uVar4;
      }
      uVar11 = uVar6 << 4;
      uVar12 = 3;
      if (2 < bVar2) {
        uVar11 = uVar4;
        uVar12 = uVar8;
      }
      uVar7 = uVar7 | uVar9;
      uVar11 = uVar11 | uVar6;
      uVar6 = uVar11 << 8;
      uVar9 = uVar7 << 8;
      if (uVar12 != 3) {
        uVar6 = uVar4;
        uVar9 = uVar4;
      }
      uVar9 = uVar9 | uVar7;
      uVar6 = uVar6 | uVar11;
      local_838 = uVar6 << 0x10;
      local_1038 = uVar9 << 0x10;
      if (1 < uVar12 - 3) {
        local_838 = uVar4;
        local_1038 = uVar4;
      }
      local_1038 = local_1038 | uVar9;
      local_1038 = local_1038 << 0x20 | local_1038;
      local_838 = local_838 | uVar6;
      local_838 = local_838 << 0x20 | local_838;
    }
    *pTruth0 = local_1038;
    *pTruth1 = local_838;
    return;
  }
LAB_003843e6:
  __assert_fail("nVars >= 0 && nVars <= 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec16.c"
                ,0x174,"word If_CluAdjust(word, int)");
}

Assistant:

void If_CluDeriveDisjoint4( word * pF, int nVars, int * V2P, int * P2V, If_Grp_t * g, If_Grp_t * r, word * pTruth0, word * pTruth1 )
{
    word pCofs[6][CLU_WRD_MAX/4];
    word Cof0, Cof1;
    int i, RetValue, nFSset = nVars - g->nVars;

    assert( g->nVars <= 6 && nFSset <= 4 );

    RetValue = If_CluCountCofs4( pF, nVars, g->nVars, pCofs );
    if ( RetValue != 3 && RetValue != 4 )
        printf( "If_CluDeriveDisjoint4(): Error!!!\n" );

    Cof0  = (pCofs[1][0] << (1 << nFSset)) | pCofs[0][0];
    Cof1  = (pCofs[3][0] << (1 << nFSset)) | pCofs[2][0];
    pF[0] = (Cof1 << (1 << (nFSset+1))) | Cof0;
    pF[0] = If_CluAdjust( pF[0], nFSset + 2 );

    // create the resulting group
    r->nVars = nFSset + 2;
    r->nMyu = 0;
    for ( i = 0; i < nFSset; i++ )
        r->pVars[i] = P2V[i];
    r->pVars[nFSset] = nVars;
    r->pVars[nFSset+1] = nVars+1;

    *pTruth0 = If_CluAdjust( pCofs[4][0], g->nVars );
    *pTruth1 = If_CluAdjust( pCofs[5][0], g->nVars );
}